

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

bool __thiscall
cmCMakePresetsGraph::ReadProjectPresetsInternal(cmCMakePresetsGraph *this,bool allowNoFiles)

{
  pointer *pppFVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  bool bVar5;
  reference presetName;
  pointer ppVar6;
  size_type sVar7;
  iterator iVar8;
  iterator iVar9;
  string *this_00;
  reference pWVar10;
  bool local_20b;
  WorkflowStep *step;
  iterator __end2;
  iterator __begin2;
  vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
  *__range2;
  ConfigurePreset *configurePreset_3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>
  *it_4;
  iterator __end1_4;
  iterator __begin1_4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
  *__range1_4;
  bool local_179;
  _Self local_178;
  _Self local_170;
  iterator configurePreset_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>
  *it_3;
  iterator __end1_3;
  iterator __begin1_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
  *__range1_3;
  bool local_131;
  _Self local_130;
  _Self local_128;
  iterator configurePreset_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>
  *it_2;
  iterator __end1_2;
  iterator __begin1_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
  *__range1_2;
  bool local_e9;
  _Self local_e8;
  _Self local_e0;
  iterator configurePreset;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>
  *it_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
  *__range1_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
  *it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
  *__range1;
  undefined1 local_90 [7];
  bool result;
  undefined4 local_70;
  undefined1 local_60 [8];
  vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_> inProgressFiles;
  string filename;
  File *file;
  bool haveOneFile;
  bool allowNoFiles_local;
  cmCMakePresetsGraph *this_local;
  
  bVar5 = false;
  pppFVar1 = &inProgressFiles.
              super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  GetUserFilename((string *)pppFVar1,&this->SourceDir);
  std::vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>::vector
            ((vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_> *)
             local_60);
  bVar4 = cmsys::SystemTools::FileExists((string *)pppFVar1);
  if (bVar4) {
    bVar5 = ReadJSONFile(this,(string *)
                              &inProgressFiles.
                               super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,User,Root,
                         (vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                          *)local_60,(File **)((long)&filename.field_2 + 8),&this->errors);
    if (!bVar5) {
      this_local._7_1_ = false;
      goto LAB_0046a5a9;
    }
    bVar5 = true;
  }
  else {
    GetFilename((string *)local_90,&this->SourceDir);
    pppFVar1 = &inProgressFiles.
                super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::operator=((string *)pppFVar1,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    bVar4 = cmsys::SystemTools::FileExists((string *)pppFVar1);
    if (bVar4) {
      bVar5 = ReadJSONFile(this,(string *)
                                &inProgressFiles.
                                 super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,Project,Root,
                           (vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                            *)local_60,(File **)((long)&filename.field_2 + 8),&this->errors);
      if (!bVar5) {
        this_local._7_1_ = false;
        goto LAB_0046a5a9;
      }
      bVar5 = true;
    }
  }
  bVar4 = std::vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>::
          empty((vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_> *
                )local_60);
  if (!bVar4) {
    __assert_fail("inProgressFiles.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCMakePresetsGraph.cxx"
                  ,0x433,"bool cmCMakePresetsGraph::ReadProjectPresetsInternal(bool)");
  }
  if (bVar5) {
    bVar5 = anon_unknown.dwarf_642c89::
            ComputePresetInheritance<cmCMakePresetsGraph::ConfigurePreset>
                      (&this->ConfigurePresets,this);
    local_20b = false;
    if (bVar5) {
      bVar5 = anon_unknown.dwarf_642c89::
              ComputePresetInheritance<cmCMakePresetsGraph::ConfigurePreset>
                        (&this->ConfigurePresets,this);
      local_20b = false;
      if (bVar5) {
        bVar5 = anon_unknown.dwarf_642c89::
                ComputePresetInheritance<cmCMakePresetsGraph::BuildPreset>(&this->BuildPresets,this)
        ;
        local_20b = false;
        if (bVar5) {
          bVar5 = anon_unknown.dwarf_642c89::
                  ComputePresetInheritance<cmCMakePresetsGraph::TestPreset>(&this->TestPresets,this)
          ;
          local_20b = false;
          if (bVar5) {
            bVar5 = anon_unknown.dwarf_642c89::
                    ComputePresetInheritance<cmCMakePresetsGraph::PackagePreset>
                              (&this->PackagePresets,this);
            local_20b = false;
            if (bVar5) {
              local_20b = anon_unknown.dwarf_642c89::
                          ComputePresetInheritance<cmCMakePresetsGraph::WorkflowPreset>
                                    (&this->WorkflowPresets,this);
            }
          }
        }
      }
    }
    __range1._7_1_ = local_20b;
    if (local_20b == false) {
      this_local._7_1_ = false;
    }
    else {
      __end1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::begin(&this->ConfigurePresets);
      it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
              ::end(&this->ConfigurePresets);
      while (bVar5 = std::operator!=(&__end1,(_Self *)&it), bVar5) {
        presetName = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                     ::operator*(&__end1);
        bVar5 = anon_unknown.dwarf_642c89::ExpandMacros<cmCMakePresetsGraph::ConfigurePreset>
                          (this,&(presetName->second).Unexpanded,&(presetName->second).Expanded);
        if (!bVar5) {
          cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(&presetName->first,&this->parseState);
          this_local._7_1_ = false;
          goto LAB_0046a5a9;
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
        ::operator++(&__end1);
      }
      __end1_1 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                 ::begin(&this->BuildPresets);
      it_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                ::end(&this->BuildPresets);
      while (bVar5 = std::operator!=(&__end1_1,(_Self *)&it_1), bVar5) {
        configurePreset._M_node =
             (_Base_ptr)
             std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>
             ::operator*(&__end1_1);
        if (((((reference)configurePreset._M_node)->second).Unexpanded.super_Preset.Hidden & 1U) ==
            0) {
          local_e0._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::find(&this->ConfigurePresets,
                      &(((reference)configurePreset._M_node)->second).Unexpanded.ConfigurePreset);
          local_e8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::end(&this->ConfigurePresets);
          bVar5 = std::operator==(&local_e0,&local_e8);
          if (bVar5) {
            cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET
                      ((string *)configurePreset._M_node,&this->parseState);
            this_local._7_1_ = false;
            goto LAB_0046a5a9;
          }
          p_Var2 = configurePreset._M_node[3]._M_parent;
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                   ::operator->(&local_e0);
          sVar7 = std::
                  unordered_set<cmCMakePresetsGraph::File_*,_std::hash<cmCMakePresetsGraph::File_*>,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::allocator<cmCMakePresetsGraph::File_*>_>
                  ::count((unordered_set<cmCMakePresetsGraph::File_*,_std::hash<cmCMakePresetsGraph::File_*>,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::allocator<cmCMakePresetsGraph::File_*>_>
                           *)&p_Var2[1]._M_parent,
                          &(ppVar6->second).Unexpanded.super_Preset.OriginFile);
          if (sVar7 == 0) {
            cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE
                      ((string *)configurePreset._M_node,&this->parseState);
            this_local._7_1_ = false;
            goto LAB_0046a5a9;
          }
          local_e9 = true;
          bVar5 = std::optional<bool>::value_or<bool>
                            ((optional<bool> *)&configurePreset._M_node[8]._M_right,&local_e9);
          if (bVar5) {
            p_Var3 = configurePreset._M_node + 6;
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                     ::operator->(&local_e0);
            iVar8 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::begin(&(ppVar6->second).Unexpanded.super_Preset.Environment);
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                     ::operator->(&local_e0);
            iVar9 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::end(&(ppVar6->second).Unexpanded.super_Preset.Environment);
            std::
            map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
            ::
            insert<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                      ((map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                        *)&p_Var3->_M_parent,
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar8._M_node,
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar9._M_node);
          }
        }
        bVar5 = anon_unknown.dwarf_642c89::ExpandMacros<cmCMakePresetsGraph::BuildPreset>
                          (this,(BuildPreset *)(configurePreset._M_node + 1),
                           (optional<cmCMakePresetsGraph::BuildPreset> *)
                           &configurePreset._M_node[0xc]._M_parent);
        if (!bVar5) {
          cmCMakePresetsErrors::INVALID_MACRO_EXPANSION
                    ((string *)configurePreset._M_node,&this->parseState);
          this_local._7_1_ = false;
          goto LAB_0046a5a9;
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>
        ::operator++(&__end1_1);
      }
      __end1_2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
                 ::begin(&this->TestPresets);
      it_2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
                ::end(&this->TestPresets);
      while (bVar5 = std::operator!=(&__end1_2,(_Self *)&it_2), bVar5) {
        configurePreset_1._M_node =
             (_Base_ptr)
             std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>
             ::operator*(&__end1_2);
        if (((((reference)configurePreset_1._M_node)->second).Unexpanded.super_Preset.Hidden & 1U)
            == 0) {
          local_128._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::find(&this->ConfigurePresets,
                      &(((reference)configurePreset_1._M_node)->second).Unexpanded.ConfigurePreset);
          local_130._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::end(&this->ConfigurePresets);
          bVar5 = std::operator==(&local_128,&local_130);
          if (bVar5) {
            cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET
                      ((string *)configurePreset_1._M_node,&this->parseState);
            this_local._7_1_ = false;
            goto LAB_0046a5a9;
          }
          p_Var2 = configurePreset_1._M_node[3]._M_parent;
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                   ::operator->(&local_128);
          sVar7 = std::
                  unordered_set<cmCMakePresetsGraph::File_*,_std::hash<cmCMakePresetsGraph::File_*>,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::allocator<cmCMakePresetsGraph::File_*>_>
                  ::count((unordered_set<cmCMakePresetsGraph::File_*,_std::hash<cmCMakePresetsGraph::File_*>,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::allocator<cmCMakePresetsGraph::File_*>_>
                           *)&p_Var2[1]._M_parent,
                          &(ppVar6->second).Unexpanded.super_Preset.OriginFile);
          if (sVar7 == 0) {
            cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE
                      ((string *)configurePreset_1._M_node,&this->parseState);
            this_local._7_1_ = false;
            goto LAB_0046a5a9;
          }
          local_131 = true;
          bVar5 = std::optional<bool>::value_or<bool>
                            ((optional<bool> *)&configurePreset_1._M_node[8]._M_right,&local_131);
          if (bVar5) {
            p_Var3 = configurePreset_1._M_node + 6;
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                     ::operator->(&local_128);
            iVar8 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::begin(&(ppVar6->second).Unexpanded.super_Preset.Environment);
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                     ::operator->(&local_128);
            iVar9 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::end(&(ppVar6->second).Unexpanded.super_Preset.Environment);
            std::
            map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
            ::
            insert<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                      ((map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                        *)&p_Var3->_M_parent,
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar8._M_node,
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar9._M_node);
          }
        }
        bVar5 = anon_unknown.dwarf_642c89::ExpandMacros<cmCMakePresetsGraph::TestPreset>
                          (this,(TestPreset *)(configurePreset_1._M_node + 1),
                           (optional<cmCMakePresetsGraph::TestPreset> *)
                           &configurePreset_1._M_node[0x1d]._M_parent);
        if (!bVar5) {
          cmCMakePresetsErrors::INVALID_MACRO_EXPANSION
                    ((string *)configurePreset_1._M_node,&this->parseState);
          this_local._7_1_ = false;
          goto LAB_0046a5a9;
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>
        ::operator++(&__end1_2);
      }
      __end1_3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
                 ::begin(&this->PackagePresets);
      it_3 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
                ::end(&this->PackagePresets);
      while (bVar5 = std::operator!=(&__end1_3,(_Self *)&it_3), bVar5) {
        configurePreset_2._M_node =
             (_Base_ptr)
             std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>
             ::operator*(&__end1_3);
        if (((((reference)configurePreset_2._M_node)->second).Unexpanded.super_Preset.Hidden & 1U)
            == 0) {
          local_170._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::find(&this->ConfigurePresets,
                      &(((reference)configurePreset_2._M_node)->second).Unexpanded.ConfigurePreset);
          local_178._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::end(&this->ConfigurePresets);
          bVar5 = std::operator==(&local_170,&local_178);
          if (bVar5) {
            cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET
                      ((string *)configurePreset_2._M_node,&this->parseState);
            this_local._7_1_ = false;
            goto LAB_0046a5a9;
          }
          p_Var2 = configurePreset_2._M_node[3]._M_parent;
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                   ::operator->(&local_170);
          sVar7 = std::
                  unordered_set<cmCMakePresetsGraph::File_*,_std::hash<cmCMakePresetsGraph::File_*>,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::allocator<cmCMakePresetsGraph::File_*>_>
                  ::count((unordered_set<cmCMakePresetsGraph::File_*,_std::hash<cmCMakePresetsGraph::File_*>,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::allocator<cmCMakePresetsGraph::File_*>_>
                           *)&p_Var2[1]._M_parent,
                          &(ppVar6->second).Unexpanded.super_Preset.OriginFile);
          if (sVar7 == 0) {
            cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE
                      ((string *)configurePreset_2._M_node,&this->parseState);
            this_local._7_1_ = false;
            goto LAB_0046a5a9;
          }
          local_179 = true;
          bVar5 = std::optional<bool>::value_or<bool>
                            ((optional<bool> *)&configurePreset_2._M_node[8]._M_right,&local_179);
          if (bVar5) {
            p_Var3 = configurePreset_2._M_node + 6;
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                     ::operator->(&local_170);
            iVar8 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::begin(&(ppVar6->second).Unexpanded.super_Preset.Environment);
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                     ::operator->(&local_170);
            iVar9 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::end(&(ppVar6->second).Unexpanded.super_Preset.Environment);
            std::
            map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
            ::
            insert<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                      ((map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                        *)&p_Var3->_M_parent,
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar8._M_node,
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar9._M_node);
          }
        }
        bVar5 = anon_unknown.dwarf_642c89::ExpandMacros<cmCMakePresetsGraph::PackagePreset>
                          (this,(PackagePreset *)(configurePreset_2._M_node + 1),
                           (optional<cmCMakePresetsGraph::PackagePreset> *)
                           &configurePreset_2._M_node[0x11]._M_parent);
        if (!bVar5) {
          cmCMakePresetsErrors::INVALID_MACRO_EXPANSION
                    ((string *)configurePreset_2._M_node,&this->parseState);
          this_local._7_1_ = false;
          goto LAB_0046a5a9;
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>
        ::operator++(&__end1_3);
      }
      __end1_4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
                 ::begin(&this->WorkflowPresets);
      it_4 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
                ::end(&this->WorkflowPresets);
      while (bVar5 = std::operator!=(&__end1_4,(_Self *)&it_4), bVar5) {
        configurePreset_3 =
             (ConfigurePreset *)
             std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>
             ::operator*(&__end1_4);
        __range2 = (vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                    *)0x0;
        this_00 = &configurePreset_3->Architecture;
        __end2 = std::
                 vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                 ::begin((vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                          *)this_00);
        step = (WorkflowStep *)
               std::
               vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
               ::end((vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                      *)this_00);
        while (bVar5 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep_*,_std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>_>
                                           *)&step), bVar5) {
          pWVar10 = __gnu_cxx::
                    __normal_iterator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep_*,_std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>_>
                    ::operator*(&__end2);
          if ((__range2 ==
               (vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                *)0x0) && (pWVar10->PresetType != Configure)) {
            cmCMakePresetsErrors::FIRST_WORKFLOW_STEP_NOT_CONFIGURE
                      (&pWVar10->PresetName,&this->parseState);
            this_local._7_1_ = false;
            goto LAB_0046a5a9;
          }
          if ((__range2 !=
               (vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                *)0x0) && (pWVar10->PresetType == Configure)) {
            cmCMakePresetsErrors::CONFIGURE_WORKFLOW_STEP_NOT_FIRST
                      (&pWVar10->PresetName,&this->parseState);
            this_local._7_1_ = false;
            goto LAB_0046a5a9;
          }
          switch(pWVar10->PresetType) {
          case Configure:
            __range1._7_1_ =
                 anon_unknown.dwarf_642c89::
                 TryReachPresetFromWorkflow<cmCMakePresetsGraph::ConfigurePreset>
                           ((WorkflowPreset *)
                            ((long)&(configurePreset_3->super_Preset).Name.field_2 + 8),
                            &this->ConfigurePresets,&pWVar10->PresetName,
                            (ConfigurePreset **)&__range2,&this->parseState);
            break;
          case Build:
            __range1._7_1_ =
                 anon_unknown.dwarf_642c89::
                 TryReachPresetFromWorkflow<cmCMakePresetsGraph::BuildPreset>
                           ((WorkflowPreset *)
                            ((long)&(configurePreset_3->super_Preset).Name.field_2 + 8),
                            &this->BuildPresets,&pWVar10->PresetName,(ConfigurePreset **)&__range2,
                            &this->parseState);
            break;
          case Test:
            __range1._7_1_ =
                 anon_unknown.dwarf_642c89::
                 TryReachPresetFromWorkflow<cmCMakePresetsGraph::TestPreset>
                           ((WorkflowPreset *)
                            ((long)&(configurePreset_3->super_Preset).Name.field_2 + 8),
                            &this->TestPresets,&pWVar10->PresetName,(ConfigurePreset **)&__range2,
                            &this->parseState);
            break;
          case Package:
            __range1._7_1_ =
                 anon_unknown.dwarf_642c89::
                 TryReachPresetFromWorkflow<cmCMakePresetsGraph::PackagePreset>
                           ((WorkflowPreset *)
                            ((long)&(configurePreset_3->super_Preset).Name.field_2 + 8),
                            &this->PackagePresets,&pWVar10->PresetName,(ConfigurePreset **)&__range2
                            ,&this->parseState);
          }
          if (__range1._7_1_ == false) {
            this_local._7_1_ = false;
            goto LAB_0046a5a9;
          }
          __gnu_cxx::
          __normal_iterator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep_*,_std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>_>
          ::operator++(&__end2);
        }
        if (__range2 ==
            (vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
             *)0x0) {
          cmCMakePresetsErrors::NO_WORKFLOW_STEPS((string *)configurePreset_3,&this->parseState);
          this_local._7_1_ = false;
          goto LAB_0046a5a9;
        }
        bVar5 = anon_unknown.dwarf_642c89::ExpandMacros<cmCMakePresetsGraph::WorkflowPreset>
                          (this,(WorkflowPreset *)
                                ((long)&(configurePreset_3->super_Preset).Name.field_2 + 8),
                           (optional<cmCMakePresetsGraph::WorkflowPreset> *)
                           ((long)&(configurePreset_3->Architecture).field_2 + 8));
        if (!bVar5) {
          cmCMakePresetsErrors::INVALID_MACRO_EXPANSION
                    ((string *)configurePreset_3,&this->parseState);
          this_local._7_1_ = false;
          goto LAB_0046a5a9;
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>
        ::operator++(&__end1_4);
      }
      this_local._7_1_ = true;
    }
  }
  else if (allowNoFiles) {
    this_local._7_1_ = true;
  }
  else {
    cmCMakePresetsErrors::FILE_NOT_FOUND
              ((string *)
               &inProgressFiles.
                super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->parseState);
    this_local._7_1_ = false;
  }
LAB_0046a5a9:
  local_70 = 1;
  std::vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>::~vector
            ((vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_> *)
             local_60);
  std::__cxx11::string::~string
            ((string *)
             &inProgressFiles.
              super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local._7_1_;
}

Assistant:

bool cmCMakePresetsGraph::ReadProjectPresetsInternal(bool allowNoFiles)
{
  bool haveOneFile = false;

  File* file;
  std::string filename = GetUserFilename(this->SourceDir);
  std::vector<File*> inProgressFiles;
  if (cmSystemTools::FileExists(filename)) {
    if (!this->ReadJSONFile(filename, RootType::User, ReadReason::Root,
                            inProgressFiles, file, this->errors)) {
      return false;
    }
    haveOneFile = true;
  } else {
    filename = GetFilename(this->SourceDir);
    if (cmSystemTools::FileExists(filename)) {
      if (!this->ReadJSONFile(filename, RootType::Project, ReadReason::Root,
                              inProgressFiles, file, this->errors)) {
        return false;
      }
      haveOneFile = true;
    }
  }
  assert(inProgressFiles.empty());

  if (!haveOneFile) {
    if (allowNoFiles) {
      return true;
    }
    cmCMakePresetsErrors::FILE_NOT_FOUND(filename, &this->parseState);
    return false;
  }

  bool result = ComputePresetInheritance(this->ConfigurePresets, *this) &&
    ComputePresetInheritance(this->ConfigurePresets, *this) &&
    ComputePresetInheritance(this->BuildPresets, *this) &&
    ComputePresetInheritance(this->TestPresets, *this) &&
    ComputePresetInheritance(this->PackagePresets, *this) &&
    ComputePresetInheritance(this->WorkflowPresets, *this);
  if (!result) {
    return false;
  }

  for (auto& it : this->ConfigurePresets) {
    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->BuildPresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET(it.first,
                                                       &this->parseState);
        return false;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE(
          it.first, &this->parseState);
        return false;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->TestPresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET(it.first,
                                                       &this->parseState);
        return false;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE(
          it.first, &this->parseState);
        return false;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->PackagePresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET(it.first,
                                                       &this->parseState);
        return false;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE(
          it.first, &this->parseState);
        return false;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->WorkflowPresets) {
    using Type = WorkflowPreset::WorkflowStep::Type;

    const ConfigurePreset* configurePreset = nullptr;
    for (auto const& step : it.second.Unexpanded.Steps) {
      if (configurePreset == nullptr && step.PresetType != Type::Configure) {
        cmCMakePresetsErrors::FIRST_WORKFLOW_STEP_NOT_CONFIGURE(
          step.PresetName, &this->parseState);
        return false;
      }
      if (configurePreset != nullptr && step.PresetType == Type::Configure) {
        cmCMakePresetsErrors::CONFIGURE_WORKFLOW_STEP_NOT_FIRST(
          step.PresetName, &this->parseState);
        return false;
      }

      switch (step.PresetType) {
        case Type::Configure:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->ConfigurePresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
        case Type::Build:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->BuildPresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
        case Type::Test:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->TestPresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
        case Type::Package:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->PackagePresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
      }
      if (!result) {
        return false;
      }
    }

    if (configurePreset == nullptr) {
      cmCMakePresetsErrors::NO_WORKFLOW_STEPS(it.first, &this->parseState);
      return false;
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  return true;
}